

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

escape * __thiscall cppcms::filters::escape::operator=(escape *this,escape *other)

{
  escape *peVar1;
  
  peVar1 = (escape *)streamable::operator=(&this->obj_,&other->obj_);
  return peVar1;
}

Assistant:

escape const &escape::operator=(escape const &other){ obj_ = other.obj_; return *this; }